

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eventregister.cpp
# Opt level: O3

unique_ptr<Event,_std::default_delete<Event>_> * __thiscall
EventRegister::on(EventRegister *this,string *event)

{
  size_type sVar1;
  pointer pcVar2;
  Event *__ptr;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  Event *this_00;
  default_delete<Event> *this_01;
  size_type sVar6;
  pointer __p;
  Event *local_50;
  string local_48;
  
  sVar1 = event->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (event->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      iVar3 = tolower((uint)(byte)pcVar2[sVar6]);
      pcVar2[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
                  *)this,event);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->m_events)._M_t._M_impl.super__Rb_tree_header) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
             ::operator[](&this->m_events,event);
    return pmVar5;
  }
  this_00 = (Event *)operator_new(0x40);
  pcVar2 = (event->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + event->_M_string_length);
  Event::Event(this_00,this,&local_48);
  local_50 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_01 = (default_delete<Event> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
            ::operator[](&this->m_events,event);
  local_50 = (Event *)0x0;
  __ptr = *(Event **)this_01;
  *(Event **)this_01 = this_00;
  if (__ptr != (Event *)0x0) {
    std::default_delete<Event>::operator()(this_01,__ptr);
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
           ::operator[](&this->m_events,event);
  if (local_50 != (Event *)0x0) {
    std::default_delete<Event>::operator()((default_delete<Event> *)&local_50,local_50);
  }
  return pmVar5;
}

Assistant:

const std::unique_ptr<Event> &EventRegister::on(std::string event)
{
    toLower(event);
    if (m_events.find(event) != m_events.end()) {
        return m_events[event];
    }

    std::unique_ptr<Event> ev = std::make_unique<Event>(this, event);
    m_events[event] = std::move(ev);
    return m_events[event];
}